

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::lazyComputeWordVectors(FastText *this)

{
  bool bVar1;
  int32_t iVar2;
  element_type *this_00;
  unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_> *this_01;
  int64_t in_RDI;
  DenseMatrix *unaff_retaddr;
  DenseMatrix *in_stack_00000018;
  FastText *in_stack_00000020;
  pointer in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  int64_t in_stack_fffffffffffffff0;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                      *)0x19379c);
  if (!bVar1) {
    operator_new(0x30);
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1937c1);
    iVar2 = Dictionary::nwords(this_00);
    this_01 = (unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_> *)
              (long)iVar2;
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1937e4);
    DenseMatrix::DenseMatrix(unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
    std::unique_ptr<fasttext::DenseMatrix,std::default_delete<fasttext::DenseMatrix>>::
    unique_ptr<std::default_delete<fasttext::DenseMatrix>,void>(this_01,in_stack_ffffffffffffffb8);
    std::unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>::operator=
              (this_01,(unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                        *)in_stack_ffffffffffffffb8);
    std::unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>::~unique_ptr
              ((unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    std::unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>::operator*
              (this_01);
    precomputeWordVectors(in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

void FastText::lazyComputeWordVectors() {
  if (!wordVectors_) {
    wordVectors_ = std::unique_ptr<DenseMatrix>(
        new DenseMatrix(dict_->nwords(), args_->dim));
    precomputeWordVectors(*wordVectors_);
  }
}